

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O1

void __thiscall IsoWriter::~IsoWriter(IsoWriter *this)

{
  FileEntryInfo *pFVar1;
  pointer pcVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  int in_ESI;
  
  close(this,in_ESI);
  pFVar1 = this->m_rootDirInfo;
  if (pFVar1 != (FileEntryInfo *)0x0) {
    FileEntryInfo::~FileEntryInfo(pFVar1);
    operator_delete(pFVar1,0xa8);
  }
  pFVar1 = this->m_systemStreamDir;
  if (pFVar1 != (FileEntryInfo *)0x0) {
    FileEntryInfo::~FileEntryInfo(pFVar1);
    operator_delete(pFVar1,0xa8);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_MappingEntry>,_std::_Select1st<std::pair<const_int,_MappingEntry>_>,_std::less<int>,_std::allocator<std::pair<const_int,_MappingEntry>_>_>
  ::~_Rb_tree(&(this->m_mappingEntries)._M_t);
  File::~File(&this->m_file);
  pcVar2 = (this->m_appId)._M_dataplus._M_p;
  paVar3 = &(this->m_appId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_impId)._M_dataplus._M_p;
  paVar3 = &(this->m_impId).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_volumeLabel)._M_dataplus._M_p;
  paVar3 = &(this->m_volumeLabel).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar3) {
    operator_delete(pcVar2,paVar3->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

IsoWriter::~IsoWriter()
{
    close();
    delete m_rootDirInfo;
    delete m_systemStreamDir;
}